

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O1

Ptr<Buffer> __thiscall
myvk::Buffer::CreateStaging<float*>
          (Buffer *this,Ptr<Device> *device,float *begin,float *end,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queues)

{
  Buffer *this_00;
  void *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  VkDeviceSize size;
  Ptr<Buffer> PVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  size = (long)end - (long)begin;
  PVar2 = Create(this,device,size,0x404,1,VMA_MEMORY_USAGE_AUTO,access_queues);
  _Var1 = PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = (Buffer *)(this->super_BufferBase).super_DeviceObjectBase.super_Base._vptr_Base;
  if (this_00->m_mapped_ptr == (void *)0x0) {
    __dest = Map(this_00);
    if (end != begin) {
      memmove(__dest,begin,size);
    }
    Unmap(this_00);
    _Var1._M_pi = extraout_RDX_00;
  }
  else if (end != begin) {
    memmove(this_00->m_mapped_ptr,begin,size);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi
  ;
  PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Buffer>)PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ptr<Buffer> CreateStaging(const Ptr<Device> &device, Iter begin, Iter end,
	                                 const std::vector<Ptr<Queue>> &access_queues = {}) {
		using T = typename std::iterator_traits<Iter>::value_type;
		Ptr<Buffer> ret =
		    Create(device, (end - begin) * sizeof(T),
		           VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		           VK_BUFFER_USAGE_TRANSFER_SRC_BIT, VMA_MEMORY_USAGE_AUTO, access_queues);
		ret->UpdateData(begin, end, 0);
		return ret;
	}